

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAllExact(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  Bmc_EsPar_t *pPars;
  uint uVar5;
  int iVar6;
  Bmc_EsPar_t Pars;
  Bmc_EsPar_t local_78;
  
  local_78.nVars = 0;
  local_78.nNodes = 0;
  local_78.pTtStr = (char *)0x0;
  local_78.nLutSize = 2;
  local_78.nMajSupp = 0;
  local_78.fMajority = 0;
  local_78.fUseIncr = 0;
  local_78.fOnlyAnd = 0;
  local_78.fGlucose = 0;
  local_78.fOrderNodes = 0;
  local_78.fEnumSols = 0;
  local_78.fFewerVars = 0;
  local_78.RuntimeLim = 0;
  local_78._48_8_ = 1;
  Extra_UtilGetoptReset();
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"MINKiaoegvh"), iVar6 = globalUtilOptind, 0x60 < iVar1
          ) {
      switch(iVar1) {
      case 0x61:
        local_78.fOnlyAnd = local_78.fOnlyAnd ^ 1;
        break;
      case 0x62:
      case 99:
      case 100:
      case 0x66:
      case 0x68:
        goto switchD_0025629f_caseD_62;
      case 0x65:
        local_78.fEnumSols = local_78.fEnumSols ^ 1;
        break;
      case 0x67:
        local_78.fGlucose = local_78.fGlucose ^ 1;
        break;
      case 0x69:
        local_78.fUseIncr = local_78.fUseIncr ^ 1;
        break;
      default:
        if (iVar1 == 0x6f) {
          local_78.fOrderNodes = local_78.fOrderNodes ^ 1;
        }
        else {
          if (iVar1 != 0x76) goto switchD_0025629f_caseD_62;
          local_78._48_8_ = local_78._48_8_ ^ 1;
        }
      }
    }
    switch(iVar1) {
    case 0x49:
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-I\" should be followed by an integer.\n";
LAB_00256423:
        Abc_Print(-1,pcVar3);
        goto switchD_0025629f_caseD_62;
      }
      uVar5 = atoi(argv[globalUtilOptind]);
      local_78.nVars = uVar5;
      break;
    case 0x4a:
    case 0x4c:
      goto switchD_0025629f_caseD_62;
    case 0x4b:
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-K\" should be followed by an integer.\n";
        goto LAB_00256423;
      }
      uVar5 = atoi(argv[globalUtilOptind]);
      local_78.nLutSize = uVar5;
      break;
    case 0x4d:
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-M\" should be followed by an integer.\n";
        goto LAB_00256423;
      }
      uVar5 = atoi(argv[globalUtilOptind]);
      local_78.nMajSupp = uVar5;
      break;
    case 0x4e:
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-N\" should be followed by an integer.\n";
        goto LAB_00256423;
      }
      uVar5 = atoi(argv[globalUtilOptind]);
      local_78.nNodes = uVar5;
      break;
    default:
      if (iVar1 == -1) {
        if (local_78.nMajSupp < 1) {
          if (local_78.nVars == 0) {
            pcVar3 = "The number of variables (-I num) needs to be specified on the command line.\n"
            ;
          }
          else if (local_78.nNodes == 0) {
            pcVar3 = "The number of nodes (-N num) needs to be specified on the command line.\n";
          }
          else {
            if (globalUtilOptind + 1 == argc) {
              local_78.pTtStr = argv[globalUtilOptind];
            }
            if (local_78.pTtStr != (char *)0x0) {
              uVar5 = 1 << ((char)local_78.nVars - 2U & 0x1f);
              sVar2 = strlen(local_78.pTtStr);
              if (uVar5 != (uint)sVar2) {
                Abc_Print(-1,"Truth table is expected to have %d hex digits (instead of %d).\n",
                          (ulong)uVar5,sVar2);
                return 1;
              }
              goto LAB_00256627;
            }
            pcVar3 = "Truth table should be given on the command line.\n";
          }
        }
        else if (((uint)local_78.nMajSupp < 10) &&
                ((0x2a0U >> (local_78.nMajSupp & 0x1fU) & 1) != 0)) {
          local_78.nVars = local_78.nMajSupp;
          local_78.nLutSize = 3;
          local_78.fMajority = 1;
          local_78.fUseIncr = 1;
          if (local_78.nNodes == 0) {
            if (local_78.nMajSupp == 5) {
              local_78.nNodes = 4;
            }
            else if (local_78.nMajSupp == 9) {
              local_78.nNodes = 10;
            }
            else {
              if (local_78.nMajSupp != 7) goto LAB_00256627;
              local_78.nNodes = 7;
            }
          }
LAB_00256627:
          if ((int)((local_78.nLutSize - 1U) * local_78.nNodes + 1) < local_78.nVars) {
            Abc_Print(-1,"Function with %d variales cannot be implemented with %d %d-input LUTs.\n")
            ;
            return 1;
          }
          if (local_78.nVars < 0xb) {
            if (local_78.nLutSize < 7) {
              if (local_78.fUseIncr != 0) {
LAB_00256684:
                Zyx_ManExactSynthesis(&local_78);
                return 0;
              }
              if (local_78.fMajority == 0) {
                if (local_78.nLutSize < 4) goto LAB_00256684;
                pcVar3 = "Cannot synthesize LUT4 and larger in non-incremental mode (use \'-i\').\n"
                ;
              }
              else {
                pcVar3 = "Cannot synthesize majority in the non-incremental mode (use \'-i\').\n";
              }
            }
            else {
              pcVar3 = "Node size should not be more than 6 inputs.\n";
            }
          }
          else {
            pcVar3 = "Function should not have more than 10 inputs.\n";
          }
        }
        else {
          pcVar3 = "Currently only support majority with 5, 7 or 9 inputs.\n";
        }
        iVar6 = -1;
        goto LAB_00256578;
      }
      goto switchD_0025629f_caseD_62;
    }
    globalUtilOptind = iVar6 + 1;
  } while (-1 < (int)uVar5);
switchD_0025629f_caseD_62:
  Abc_Print(-2,"usage: allexact [-MIKN <num>] [-iaoevh] <hex>\n");
  Abc_Print(-2,"\t           exact synthesis of I-input function using N K-input gates\n");
  Abc_Print(-2,"\t-M <num> : the majority support size (overrides -I and -K) [default = %d]\n",
            (ulong)(uint)local_78.nMajSupp);
  Abc_Print(-2,"\t-I <num> : the number of input variables [default = %d]\n",
            local_78._0_8_ & 0xffffffff);
  Abc_Print(-2,"\t-K <num> : the number of node fanins [default = %d]\n",
            (ulong)(uint)local_78.nLutSize);
  Abc_Print(-2,"\t-N <num> : the number of K-input nodes [default = %d]\n",
            (ulong)local_78._0_8_ >> 0x20);
  pcVar4 = "yes";
  pcVar3 = "yes";
  if (local_78.fUseIncr == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-i       : toggle using incremental solving [default = %s]\n",pcVar3);
  pcVar3 = "yes";
  if (local_78.fOnlyAnd == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-a       : toggle using only AND-gates when K = 2 [default = %s]\n",pcVar3);
  pcVar3 = "yes";
  if (local_78.fOrderNodes == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-o       : toggle using node ordering by fanins [default = %s]\n",pcVar3);
  pcVar3 = "yes";
  if (local_78.fEnumSols == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-e       : toggle enumerating all solutions [default = %s]\n",pcVar3);
  if (local_78.fVerbose == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-v       : toggle verbose printout [default = %s]\n",pcVar4);
  Abc_Print(-2,"\t-h       : print the command usage\n");
  pcVar3 = "\t<hex>    : truth table in hex notation\n";
  iVar6 = -2;
LAB_00256578:
  Abc_Print(iVar6,pcVar3);
  return 1;
}

Assistant:

int Abc_CommandAllExact( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Zyx_ManExactSynthesis( Bmc_EsPar_t * pPars );
    int c;
    Bmc_EsPar_t Pars, * pPars = &Pars;
    Bmc_EsParSetDefault( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "MINKiaoegvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nMajSupp = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nMajSupp < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nVars = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nVars < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nNodes = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nNodes < 0 )
                goto usage;
            break;
       case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLutSize < 0 )
                goto usage;
            break;
        case 'i':
            pPars->fUseIncr ^= 1;
            break;
        case 'a':
            pPars->fOnlyAnd ^= 1;
            break;
        case 'o':
            pPars->fOrderNodes ^= 1;
            break;
        case 'e':
            pPars->fEnumSols ^= 1;
            break;
        case 'g':
            pPars->fGlucose ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pPars->nMajSupp > 0 )
    {
        if ( pPars->nMajSupp != 5 && pPars->nMajSupp != 7 && pPars->nMajSupp != 9 )
        {
            Abc_Print( -1, "Currently only support majority with 5, 7 or 9 inputs.\n" );
            return 1;
        }
        pPars->nVars = pPars->nMajSupp;
        pPars->nLutSize = 3;
        pPars->fMajority = 1;
        pPars->fUseIncr = 1;
        if ( pPars->nNodes == 0 )
        {
            if ( pPars->nMajSupp == 5 )
                pPars->nNodes = 4;
            if ( pPars->nMajSupp == 7 )
                pPars->nNodes = 7;
            if ( pPars->nMajSupp == 9 )
                pPars->nNodes = 10;
        }
    }
    else
    {
        if ( pPars->nVars == 0 )
        {
            Abc_Print( -1, "The number of variables (-I num) needs to be specified on the command line.\n" );
            return 1;
        }
        if ( pPars->nNodes == 0 )
        {
            Abc_Print( -1, "The number of nodes (-N num) needs to be specified on the command line.\n" );
            return 1;
        }
        if ( argc == globalUtilOptind + 1 )
            pPars->pTtStr = argv[globalUtilOptind];
        if ( pPars->pTtStr == NULL )
        {
            Abc_Print( -1, "Truth table should be given on the command line.\n" );
            return 1;
        }
        if ( (1 << (pPars->nVars-2)) != (int)strlen(pPars->pTtStr) )
        {
            Abc_Print( -1, "Truth table is expected to have %d hex digits (instead of %d).\n", (1 << (pPars->nVars-2)), strlen(pPars->pTtStr) );
            return 1;
        }
    }
    if ( pPars->nVars > pPars->nNodes * (pPars->nLutSize - 1) + 1 )
    {
        Abc_Print( -1, "Function with %d variales cannot be implemented with %d %d-input LUTs.\n", pPars->nVars, pPars->nNodes, pPars->nLutSize );
        return 1;
    }
    if ( pPars->nVars > 10 )
    {
        Abc_Print( -1, "Function should not have more than 10 inputs.\n" );
        return 1;
    }
    if ( pPars->nLutSize > 6 )
    {
        Abc_Print( -1, "Node size should not be more than 6 inputs.\n" );
        return 1;
    }
    if ( !pPars->fUseIncr )
    {
        if ( pPars->fMajority )
        {
            Abc_Print( -1, "Cannot synthesize majority in the non-incremental mode (use \'-i\').\n" );
            return 1;
        }
        if ( pPars->nLutSize > 3 )
        {
            Abc_Print( -1, "Cannot synthesize LUT4 and larger in non-incremental mode (use \'-i\').\n" );
            return 1;
        }
    }
    Zyx_ManExactSynthesis( pPars );
    return 0;

usage:
    Abc_Print( -2, "usage: allexact [-MIKN <num>] [-iaoevh] <hex>\n" );
    Abc_Print( -2, "\t           exact synthesis of I-input function using N K-input gates\n" );
    Abc_Print( -2, "\t-M <num> : the majority support size (overrides -I and -K) [default = %d]\n", pPars->nMajSupp );
    Abc_Print( -2, "\t-I <num> : the number of input variables [default = %d]\n", pPars->nVars );
    Abc_Print( -2, "\t-K <num> : the number of node fanins [default = %d]\n", pPars->nLutSize );
    Abc_Print( -2, "\t-N <num> : the number of K-input nodes [default = %d]\n", pPars->nNodes );
    Abc_Print( -2, "\t-i       : toggle using incremental solving [default = %s]\n", pPars->fUseIncr ? "yes" : "no" );
    Abc_Print( -2, "\t-a       : toggle using only AND-gates when K = 2 [default = %s]\n", pPars->fOnlyAnd ? "yes" : "no" );
    Abc_Print( -2, "\t-o       : toggle using node ordering by fanins [default = %s]\n", pPars->fOrderNodes ? "yes" : "no" );
    Abc_Print( -2, "\t-e       : toggle enumerating all solutions [default = %s]\n", pPars->fEnumSols ? "yes" : "no" );
//    Abc_Print( -2, "\t-g       : toggle using Glucose 3.0 by Gilles Audemard and Laurent Simon [default = %s]\n", pPars->fGlucose ? "yes" : "no" );
    Abc_Print( -2, "\t-v       : toggle verbose printout [default = %s]\n", pPars->fVerbose ? "yes" : "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n" );
    Abc_Print( -2, "\t<hex>    : truth table in hex notation\n" );
    return 1;
}